

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# like.cpp
# Opt level: O1

bool __thiscall duckdb::LikeMatcher::Match(LikeMatcher *this,string_t *str)

{
  vector<duckdb::LikeSegment,_true> *this_00;
  bool bVar1;
  pointer pLVar2;
  pointer pLVar3;
  ulong __n;
  byte bVar4;
  int iVar5;
  ulong in_RAX;
  reference pvVar6;
  idx_t iVar7;
  idx_t iVar8;
  long lVar9;
  char *haystack;
  size_type __n_00;
  ulong uVar10;
  ulong haystack_size;
  
  uVar10 = (ulong)(str->value).pointer.length;
  if (uVar10 < 0xd) {
    haystack = (str->value).pointer.prefix;
  }
  else {
    haystack = (str->value).pointer.ptr;
  }
  this_00 = &this->segments;
  pLVar2 = (this->segments).super_vector<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>.
           super__Vector_base<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pLVar3 = (this->segments).super_vector<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>.
           super__Vector_base<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (this->has_start_percentage == false) {
    pvVar6 = vector<duckdb::LikeSegment,_true>::operator[](this_00,0);
    __n = (pvVar6->pattern)._M_string_length;
    haystack_size = uVar10 - __n;
    if ((uVar10 < __n) ||
       (iVar5 = bcmp(haystack,(pvVar6->pattern)._M_dataplus._M_p,__n), iVar5 != 0)) {
      bVar1 = false;
      __n_00 = 0;
      in_RAX = 0;
      haystack_size = uVar10;
    }
    else {
      haystack = haystack + __n;
      in_RAX = (long)(this->segments).
                     super_vector<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>.
                     super__Vector_base<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(this->segments).
                     super_vector<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>.
                     super__Vector_base<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      __n_00 = 1;
      if (in_RAX == 0x20) {
        in_RAX = (ulong)(byte)(haystack_size == 0 | this->has_end_percentage);
        bVar1 = false;
      }
      else {
        bVar1 = true;
      }
    }
    bVar4 = (byte)in_RAX;
    if (!bVar1) goto LAB_00a10aee;
  }
  else {
    __n_00 = 0;
    haystack_size = uVar10;
  }
  uVar10 = ((long)pLVar2 - (long)pLVar3 >> 5) - 1;
  if (__n_00 < uVar10) {
    do {
      pvVar6 = vector<duckdb::LikeSegment,_true>::operator[](this_00,__n_00);
      iVar8 = (pvVar6->pattern)._M_string_length;
      iVar7 = FindStrInStr((uchar *)haystack,haystack_size,
                           (uchar *)(pvVar6->pattern)._M_dataplus._M_p,iVar8);
      bVar4 = iVar7 != 0xffffffffffffffff & (byte)in_RAX;
      in_RAX = (ulong)bVar4;
      if (iVar7 == 0xffffffffffffffff) goto LAB_00a10aee;
      lVar9 = iVar7 + iVar8;
      haystack = haystack + lVar9;
      haystack_size = haystack_size - lVar9;
      __n_00 = __n_00 + 1;
    } while (uVar10 != __n_00);
  }
  bVar1 = this->has_end_percentage;
  pvVar6 = vector<duckdb::LikeSegment,_true>::back(this_00);
  if (bVar1 == false) {
    uVar10 = (pvVar6->pattern)._M_string_length;
    if (haystack_size < uVar10) {
      bVar4 = 0;
    }
    else {
      iVar5 = bcmp(haystack + (haystack_size - uVar10),(pvVar6->pattern)._M_dataplus._M_p,uVar10);
      bVar4 = iVar5 == 0;
    }
  }
  else {
    iVar8 = FindStrInStr((uchar *)haystack,haystack_size,(uchar *)(pvVar6->pattern)._M_dataplus._M_p
                         ,(pvVar6->pattern)._M_string_length);
    bVar4 = iVar8 != 0xffffffffffffffff;
  }
LAB_00a10aee:
  return (bool)(bVar4 & 1);
}

Assistant:

bool Match(string_t &str) {
		auto str_data = const_uchar_ptr_cast(str.GetData());
		auto str_len = str.GetSize();
		idx_t segment_idx = 0;
		idx_t end_idx = segments.size() - 1;
		if (!has_start_percentage) {
			// no start sample_size: match the first part of the string directly
			auto &segment = segments[0];
			if (str_len < segment.pattern.size()) {
				return false;
			}
			if (memcmp(str_data, segment.pattern.c_str(), segment.pattern.size()) != 0) {
				return false;
			}
			str_data += segment.pattern.size();
			str_len -= segment.pattern.size();
			segment_idx++;
			if (segments.size() == 1) {
				// only one segment, and it matches
				// we have a match if there is an end sample_size, OR if the memcmp was an exact match (remaining str is
				// empty)
				return has_end_percentage || str_len == 0;
			}
		}
		// main match loop: for every segment in the middle, use Contains to find the needle in the haystack
		for (; segment_idx < end_idx; segment_idx++) {
			auto &segment = segments[segment_idx];
			// find the pattern of the current segment
			idx_t next_offset =
			    FindStrInStr(str_data, str_len, const_uchar_ptr_cast(segment.pattern.c_str()), segment.pattern.size());
			if (next_offset == DConstants::INVALID_INDEX) {
				// could not find this pattern in the string: no match
				return false;
			}
			idx_t offset = next_offset + segment.pattern.size();
			str_data += offset;
			str_len -= offset;
		}
		if (!has_end_percentage) {
			end_idx--;
			// no end sample_size: match the final segment now
			auto &segment = segments.back();
			if (str_len < segment.pattern.size()) {
				return false;
			}
			if (memcmp(str_data + str_len - segment.pattern.size(), segment.pattern.c_str(), segment.pattern.size()) !=
			    0) {
				return false;
			}
			return true;
		} else {
			auto &segment = segments.back();
			// find the pattern of the current segment
			idx_t next_offset =
			    FindStrInStr(str_data, str_len, const_uchar_ptr_cast(segment.pattern.c_str()), segment.pattern.size());
			return next_offset != DConstants::INVALID_INDEX;
		}
	}